

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Tag::Tag(Tag *this,string_view name)

{
  allocator<char> local_21;
  Tag *local_20;
  Tag *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Tag *)name._M_len;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_21);
  std::allocator<char>::~allocator(&local_21);
  FuncDeclaration::FuncDeclaration(&this->decl);
  return;
}

Assistant:

explicit Tag(std::string_view name) : name(name) {}